

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy,QRect *r)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  char cVar2;
  QGraphicsProxyWidget *this_01;
  QRect *r_00;
  QRect *pQVar3;
  QRect *rect;
  long in_FS_OFFSET;
  QRect QVar4;
  QRectF local_98;
  QPointF local_78;
  QPoint local_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->data->widget_attributes;
  if (((((uVar1 >> 10 & 1) == 0) || (*(long *)(*(long *)&this->field_0x8 + 0x28) != 0)) &&
      (dy != 0 || dx != 0)) && ((uVar1 & 0x8000) != 0)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    this_01 = (QGraphicsProxyWidget *)QWidgetPrivate::nearestGraphicsProxyWidget(this);
    if (this_01 == (QGraphicsProxyWidget *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidgetPrivate::scrollRect(this_00,r,dx,dy);
        return;
      }
      goto LAB_0030175a;
    }
    cVar2 = QRegion::isEmpty();
    if (cVar2 == '\0') {
      QRegion::translated((int)&local_58,(int)this_00 + 0xe0);
      QRegion::operator&((QRegion *)&local_98,(QRect *)&local_58);
      QRegion::~QRegion((QRegion *)&local_58);
      r_00 = (QRect *)QRegion::begin();
      pQVar3 = (QRect *)QRegion::end();
      for (; r_00 != pQVar3; r_00 = r_00 + 1) {
        QRectF::QRectF(&local_58,r_00);
        QGraphicsItem::update((QGraphicsItem *)(this_01 + 0x10),&local_58);
      }
      QRegion::~QRegion((QRegion *)&local_98);
    }
    QGraphicsProxyWidget::subWidgetRect(&local_98,this_01,this);
    local_78.xp = local_98.xp;
    local_78.yp = local_98.yp;
    local_60 = QPointF::toPoint(&local_78);
    QVar4 = QRect::translated(r,&local_60);
    local_58.xp = (qreal)QVar4.x1.m_i.m_i;
    local_58.yp = (qreal)QVar4.y1.m_i.m_i;
    local_58.w = (qreal)(((long)QVar4.x2.m_i.m_i - (long)QVar4.x1.m_i.m_i) + 1);
    local_58.h = (qreal)(((QVar4._8_8_ >> 0x20) - (QVar4._0_8_ >> 0x20)) + 1);
    QGraphicsItem::scroll((QGraphicsItem *)(this_01 + 0x10),(double)dx,(double)dy,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0030175a:
  __stack_chk_fail();
}

Assistant:

void QWidget::scroll(int dx, int dy, const QRect &r)
{

    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        if (!d->dirty.isEmpty()) {
            for (const QRect &rect : d->dirty.translated(dx, dy) & r)
                proxy->update(rect);
        }
        proxy->scroll(dx, dy, r.translated(proxy->subWidgetRect(this).topLeft().toPoint()));
        return;
    }
#endif
    d->scroll_sys(dx, dy, r);
}